

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O0

bool __thiscall
pstore::command_line::
list<pstore::trailer::indices,_pstore::command_line::parser<pstore::trailer::indices,_void>_>::
comma_separated(list<pstore::trailer::indices,_pstore::command_line::parser<pstore::trailer::indices,_void>_>
                *this,string *v)

{
  bool bVar1;
  reference v_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *subvalue;
  _Self local_50;
  iterator __end2;
  iterator __begin2;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string *v_local;
  list<pstore::trailer::indices,_pstore::command_line::parser<pstore::trailer::indices,_void>_>
  *this_local;
  
  csv((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)&__begin2,v);
  __end2 = std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__begin2);
  local_50._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__begin2);
  do {
    bVar1 = std::operator!=(&__end2,&local_50);
    if (!bVar1) {
      subvalue._4_4_ = 2;
LAB_001255ed:
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__begin2);
      if (subvalue._4_4_ != 1) {
        this_local._7_1_ = 1;
      }
      return (bool)(this_local._7_1_ & 1);
    }
    v_00 = std::
           _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&__end2);
    bVar1 = simple_value(this,v_00);
    if (!bVar1) {
      this_local._7_1_ = 0;
      subvalue._4_4_ = 1;
      goto LAB_001255ed;
    }
    std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool list<T, Parser>::comma_separated (std::string const & v) {
            for (auto const & subvalue : csv (v)) {
                if (!this->simple_value (subvalue)) {
                    return false;
                }
            }
            return true;
        }